

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O3

void __thiscall dtc::dtb::asm_writer::write_label(asm_writer *this,string *name)

{
  undefined8 in_RAX;
  byte_buffer *buffer;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  write_line(this,"\t.globl ");
  buffer = &this->buffer;
  push_string(buffer,name,false);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (buffer,(uchar *)((long)&uStack_28 + 7));
  push_string(buffer,name,false);
  uStack_28._0_7_ = CONCAT16(0x3a,(undefined6)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (buffer,(uchar *)((long)&uStack_28 + 6));
  uStack_28._0_6_ = CONCAT15(10,(undefined5)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (buffer,(uchar *)((long)&uStack_28 + 5));
  uStack_28._0_5_ = CONCAT14(0x5f,(undefined4)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (buffer,(uchar *)((long)&uStack_28 + 4));
  push_string(buffer,name,false);
  uStack_28._0_4_ = CONCAT13(0x3a,(undefined3)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (buffer,(uchar *)((long)&uStack_28 + 3));
  uStack_28._0_3_ = CONCAT12(10,(undefined2)uStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (buffer,(uchar *)((long)&uStack_28 + 2));
  return;
}

Assistant:

void
asm_writer::write_label(const string &name)
{
	write_line("\t.globl ");
	push_string(buffer, name);
	buffer.push_back('\n');
	push_string(buffer, name);
	buffer.push_back(':');
	buffer.push_back('\n');
	buffer.push_back('_');
	push_string(buffer, name);
	buffer.push_back(':');
	buffer.push_back('\n');
	
}